

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_detached(void)

{
  int iVar1;
  int iVar2;
  uv_pid_t uVar3;
  int extraout_EAX;
  uv_loop_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper4",detach_failure_cb);
  options.flags._0_1_ = (byte)options.flags | 8;
  puVar4 = uv_default_loop();
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    uv_unref((uv_handle_t *)&process);
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    iVar1 = process.pid;
    if (iVar2 != 0) goto LAB_001bd847;
    if (exit_cb_called != 0) goto LAB_001bd854;
    uVar3 = uv_process_get_pid(&process);
    if (iVar1 != uVar3) goto LAB_001bd861;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_001bd86e;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 == 0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bd888;
    }
  }
  else {
    run_test_spawn_detached_cold_1();
LAB_001bd847:
    run_test_spawn_detached_cold_2();
LAB_001bd854:
    run_test_spawn_detached_cold_3();
LAB_001bd861:
    run_test_spawn_detached_cold_4();
LAB_001bd86e:
    run_test_spawn_detached_cold_5();
  }
  run_test_spawn_detached_cold_6();
LAB_001bd888:
  run_test_spawn_detached_cold_7();
  puts("detach_cb");
  exit_cb_called = exit_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_detached) {
  int r;

  init_process_options("spawn_helper4", detach_failure_cb);

  options.flags |= UV_PROCESS_DETACHED;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*) &process);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  ASSERT_EQ(process.pid, uv_process_get_pid(&process));

  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}